

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O1

h__Reader * __thiscall
ASDCP::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc
          (h__Reader *this,TimedTextDescriptor *TDesc)

{
  _List_node_base *p_Var1;
  undefined8 uVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  ui32_t uVar5;
  long lVar6;
  _List_node_base *p_Var7;
  ILogSink *this_00;
  undefined8 *in_RDX;
  _List_node_base *Object;
  uint uVar8;
  InterchangeObject *tmp_iobj;
  Result_t result;
  undefined1 local_100 [9];
  _List_node_base *local_f7;
  _List_node_base *p_Stack_ef;
  undefined **local_e0;
  bool local_d8;
  byte_t local_d7 [8];
  byte_t abStack_cf [55];
  ui32_t local_98 [26];
  
  p_Var1 = TDesc[10].ResourceList.
           super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  if (p_Var1 == (_List_node_base *)0x0) {
    __assert_fail("m_EssenceDescriptor",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_TimedText.cpp"
                  ,0x9b,
                  "ASDCP::Result_t ASDCP::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedText::TimedTextDescriptor &)"
                 );
  }
  TDesc[0xb].AssetID[8] = '\0';
  TDesc[0xb].AssetID[9] = '\0';
  TDesc[0xb].AssetID[10] = '\0';
  TDesc[0xb].AssetID[0xb] = '\0';
  TDesc[0xb].AssetID[0xc] = '\0';
  TDesc[0xb].AssetID[0xd] = '\0';
  TDesc[0xb].AssetID[0xe] = '\0';
  TDesc[0xb].AssetID[0xf] = '\0';
  *(undefined8 *)&TDesc[0xb].field_0x1c = 0;
  *in_RDX = p_Var1[0xf]._M_next;
  if (*(char *)&p_Var1[0x10]._M_next == '\x01') {
    if ((ulong)p_Var1[0xf]._M_prev >> 0x20 != 0) {
      __assert_fail("TDescObj->ContainerDuration <= 0xFFFFFFFFL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_TimedText.cpp"
                    ,0xa2,
                    "ASDCP::Result_t ASDCP::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedText::TimedTextDescriptor &)"
                   );
    }
    *(int *)(in_RDX + 1) = (int)p_Var1[0xf]._M_prev;
  }
  uVar2 = *(undefined8 *)((long)&p_Var1[0x18]._M_next + 1);
  *(undefined8 *)((long)in_RDX + 0xc) = *(undefined8 *)((long)&p_Var1[0x17]._M_prev + 1);
  *(undefined8 *)((long)in_RDX + 0x14) = uVar2;
  std::__cxx11::string::_M_assign((string *)(in_RDX + 4));
  std::__cxx11::string::_M_assign((string *)(in_RDX + 8));
  std::__cxx11::string::_M_assign((string *)(in_RDX + 0xf));
  std::__cxx11::
  list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
  ::clear((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
           *)(in_RDX + 0xc));
  Object = p_Var1[0xc]._M_prev;
  Kumu::Result_t::Result_t((Result_t *)local_98,(Result_t *)Kumu::RESULT_OK);
  if ((Object != p_Var1[0xd]._M_next) && (-1 < (int)local_98[0])) {
    do {
      MXF::OP1aHeader::GetMDObjectByID
                ((OP1aHeader *)local_100,(UUID *)(TDesc->AssetID + 0xc),(InterchangeObject **)Object
                );
      Kumu::Result_t::operator=((Result_t *)local_98,(Result_t *)local_100);
      Kumu::Result_t::~Result_t((Result_t *)local_100);
      uVar5 = local_98[0];
      p_Var4 = p_Ram00000000000000b1;
      p_Var3 = p_Ram00000000000000a9;
      if ((int)local_98[0] < 0) {
        this_00 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error(this_00,"Broken sub-descriptor link\n");
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
      }
      else {
        lVar6 = std::__cxx11::string::find((char *)0xc8,0x1f7374,0);
        uVar8 = 2;
        if (lVar6 == -1) {
          lVar6 = std::__cxx11::string::find((char *)0xc8,0x1faa6a,0);
          if (lVar6 == -1) {
            lVar6 = std::__cxx11::string::find((char *)0xc8,0x1faa81,0);
            if (lVar6 == -1) {
              lVar6 = std::__cxx11::string::find((char *)0xc8,0x1f736a,0);
              uVar8 = (uint)(lVar6 != -1);
            }
          }
        }
        p_Var7 = (_List_node_base *)operator_new(0x28);
        p_Var7[1]._M_next = p_Var3;
        p_Var7[1]._M_prev = p_Var4;
        *(uint *)&p_Var7[2]._M_next = uVar8;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        in_RDX[0xe] = in_RDX[0xe] + 1;
        local_100[8] = uRam00000000000000a8;
        local_f7 = p_Ram00000000000000a9;
        p_Stack_ef = p_Ram00000000000000b1;
        local_100._0_8_ = &PTR__IArchive_00223d80;
        local_d8 = *(bool *)&Object->_M_prev;
        local_d7 = *(byte_t (*) [8])((long)&Object->_M_prev + 1);
        abStack_cf._0_8_ = *(undefined8 *)((long)&Object[1]._M_next + 1);
        local_e0 = &PTR__IArchive_00223d80;
        std::
        _Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,Kumu::UUID>,std::_Select1st<std::pair<Kumu::UUID_const,Kumu::UUID>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,Kumu::UUID>>>
        ::_M_insert_unique<std::pair<Kumu::UUID_const,Kumu::UUID>>
                  ((_Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,Kumu::UUID>,std::_Select1st<std::pair<Kumu::UUID_const,Kumu::UUID>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,Kumu::UUID>>>
                    *)&TDesc[10].ResourceList.
                       super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                       ._M_impl._M_node._M_size,(pair<const_Kumu::UUID,_Kumu::UUID> *)local_100);
      }
      if ((int)uVar5 < 0) goto LAB_001de8d6;
      Object = Object + 2;
    } while ((Object != p_Var1[0xd]._M_next) && (-1 < (int)local_98[0]));
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_98);
LAB_001de8d6:
  Kumu::Result_t::~Result_t((Result_t *)local_98);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::TimedText::MXFReader::h__Reader::MD_to_TimedText_TDesc(TimedText::TimedTextDescriptor& TDesc)
{
  assert(m_EssenceDescriptor);
  memset(&m_TDesc.AssetID, 0, UUIDlen);
  MXF::TimedTextDescriptor* TDescObj = (MXF::TimedTextDescriptor*)m_EssenceDescriptor;

  TDesc.EditRate = TDescObj->SampleRate;
  if ( ! TDescObj->ContainerDuration.empty() )
    {
      assert(TDescObj->ContainerDuration <= 0xFFFFFFFFL);
      TDesc.ContainerDuration = (ui32_t) TDescObj->ContainerDuration;
    }
  memcpy(TDesc.AssetID, TDescObj->ResourceID.Value(), UUIDlen);
  TDesc.NamespaceName = TDescObj->NamespaceURI;
  TDesc.EncodingName = TDescObj->UCSEncoding;
  TDesc.RFC5646LanguageTagList = TDescObj->RFC5646LanguageTagList;
  TDesc.ResourceList.clear();

  Array<UUID>::const_iterator sdi = TDescObj->SubDescriptors.begin();
  TimedTextResourceSubDescriptor* DescObject = 0;
  Result_t result = RESULT_OK;

  for ( ; sdi != TDescObj->SubDescriptors.end() && KM_SUCCESS(result); sdi++ )
    {
      InterchangeObject* tmp_iobj = 0;
      result = m_HeaderPart.GetMDObjectByID(*sdi, &tmp_iobj);
      DescObject = static_cast<TimedTextResourceSubDescriptor*>(tmp_iobj);

      if ( KM_SUCCESS(result) )
	{
	  TimedTextResourceDescriptor TmpResource;
	  memcpy(TmpResource.ResourceID, DescObject->AncillaryResourceID.Value(), UUIDlen);

	  if ( DescObject->MIMEMediaType.find("application/x-font-opentype") != std::string::npos
	       || DescObject->MIMEMediaType.find("application/x-opentype") != std::string::npos
	       || DescObject->MIMEMediaType.find("font/opentype") != std::string::npos )
	    TmpResource.Type = MT_OPENTYPE;

	  else if ( DescObject->MIMEMediaType.find("image/png") != std::string::npos )
	    TmpResource.Type = MT_PNG;

	  else
	    TmpResource.Type = MT_BIN;

	  TDesc.ResourceList.push_back(TmpResource);
	  m_ResourceMap.insert(ResourceMap_t::value_type(DescObject->AncillaryResourceID, *sdi));
	}
      else
	{
	  DefaultLogSink().Error("Broken sub-descriptor link\n");
	  return RESULT_FORMAT;
	}
    }

  return result;
}